

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Vec_Int_t * Gia_ManFindSharedInputs(Gia_Man_t *p)

{
  Gia_Obj_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  bool bVar4;
  Vec_Int_t *local_38;
  Vec_Int_t *vRes;
  int local_28;
  int Value;
  int k;
  int i;
  Gia_Obj_t *pObj2;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  pObj = (Gia_Obj_t *)p;
  iVar1 = Gia_ManCiNum(p);
  local_38 = Vec_IntStart(iVar1);
  Value = 0;
  while( true ) {
    iVar1 = Value;
    iVar2 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
    bVar4 = false;
    if (iVar1 < iVar2) {
      pObj2 = Gia_ManCo((Gia_Man_t *)pObj,Value);
      bVar4 = pObj2 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    Gia_ManIncrementTravId((Gia_Man_t *)pObj);
    p_00 = pObj;
    pObj_00 = Gia_ObjFanin0(pObj2);
    Gia_ManMarkTfi_rec((Gia_Man_t *)p_00,pObj_00);
    local_28 = 0;
    while( true ) {
      iVar1 = local_28;
      iVar2 = Vec_IntSize(*(Vec_Int_t **)&pObj[5].field_0x4);
      bVar4 = false;
      if (iVar1 < iVar2) {
        _k = Gia_ManCi((Gia_Man_t *)pObj,local_28);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjIsTravIdCurrent((Gia_Man_t *)pObj,_k);
      if (iVar1 != 0) {
        Vec_IntAddToEntry(local_38,local_28,1);
      }
      local_28 = local_28 + 1;
    }
    Value = Value + 1;
  }
  local_28 = 0;
  for (Value = 0; iVar1 = Value, iVar2 = Vec_IntSize(local_38), iVar1 < iVar2; Value = Value + 1) {
    iVar2 = Vec_IntEntry(local_38,Value);
    vRes._4_4_ = iVar2;
    iVar3 = Gia_ManCoNum((Gia_Man_t *)pObj);
    iVar1 = local_28;
    if (iVar2 == iVar3) {
      local_28 = local_28 + 1;
      Vec_IntWriteEntry(local_38,iVar1,Value);
    }
  }
  Vec_IntShrink(local_38,local_28);
  iVar1 = Vec_IntSize(local_38);
  if ((iVar1 == 0) || (iVar1 = Vec_IntSize(local_38), 10 < iVar1)) {
    Vec_IntFreeP(&local_38);
  }
  return local_38;
}

Assistant:

Vec_Int_t * Gia_ManFindSharedInputs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObj2; int i, k, Value;
    Vec_Int_t * vRes = Vec_IntStart( Gia_ManCiNum(p) );
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManIncrementTravId( p );
        Gia_ManMarkTfi_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManForEachCi( p, pObj2, k )
            if ( Gia_ObjIsTravIdCurrent(p, pObj2) )
                Vec_IntAddToEntry( vRes, k, 1 );
    }
    k = 0;
    Vec_IntForEachEntry( vRes, Value, i )
        if ( Value == Gia_ManCoNum(p) )
            Vec_IntWriteEntry( vRes, k++, i );
    Vec_IntShrink( vRes, k );
    //printf( "Found %d candidate inputs.\n", Vec_IntSize(vRes) );
    if ( Vec_IntSize(vRes) == 0 || Vec_IntSize(vRes) > 10 )
        Vec_IntFreeP(&vRes);
    return vRes;
}